

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniply-info.cpp
# Opt level: O1

bool print_ply_header(char *filename)

{
  int iVar1;
  pointer pPVar2;
  pointer puVar3;
  uint *puVar4;
  uint *puVar5;
  bool bVar6;
  bool bVar7;
  PLYFileType PVar8;
  uint uVar9;
  uint uVar10;
  uint32_t uVar11;
  PLYElement *pPVar12;
  uint *puVar13;
  uint32_t idx;
  PLYProperty *prop;
  pointer pPVar14;
  PLYReader reader;
  PLYReader local_c0;
  
  miniply::PLYReader::PLYReader(&local_c0,filename);
  bVar6 = miniply::PLYReader::valid(&local_c0);
  if (bVar6) {
    puts("ply");
    PVar8 = miniply::PLYReader::file_type(&local_c0);
    iVar1 = *(int *)(_ZL10kFileTypes_rel + (long)(int)PVar8 * 4);
    uVar9 = miniply::PLYReader::version_major(&local_c0);
    uVar10 = miniply::PLYReader::version_minor(&local_c0);
    printf("format %s %d.%d\n",_ZL10kFileTypes_rel + iVar1,(ulong)uVar9,(ulong)uVar10);
    uVar11 = miniply::PLYReader::num_elements(&local_c0);
    if (uVar11 != 0) {
      idx = 0;
      do {
        pPVar12 = miniply::PLYReader::get_element(&local_c0,idx);
        printf("element %s %u\n",(pPVar12->name)._M_dataplus._M_p,(ulong)pPVar12->count);
        pPVar2 = (pPVar12->properties).
                 super__Vector_base<miniply::PLYProperty,_std::allocator<miniply::PLYProperty>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pPVar14 = (pPVar12->properties).
                       super__Vector_base<miniply::PLYProperty,_std::allocator<miniply::PLYProperty>_>
                       ._M_impl.super__Vector_impl_data._M_start; pPVar14 != pPVar2;
            pPVar14 = pPVar14 + 1) {
          if ((ulong)pPVar14->countType == 8) {
            printf("property %s %s\n",kPropertyTypes[pPVar14->type],(pPVar14->name)._M_dataplus._M_p
                  );
          }
          else {
            printf("property list %s %s %s\n",kPropertyTypes[pPVar14->countType],
                   kPropertyTypes[pPVar14->type],(pPVar14->name)._M_dataplus._M_p);
          }
        }
        idx = idx + 1;
      } while (idx != uVar11);
    }
    puts("end_header");
    while (bVar7 = miniply::PLYReader::has_element(&local_c0), bVar7) {
      pPVar12 = miniply::PLYReader::element(&local_c0);
      if ((pPVar12->fixedSize == false) && (pPVar12->count != 0)) {
        bVar7 = miniply::PLYReader::load_element(&local_c0);
        if (!bVar7) {
          print_ply_header();
        }
        pPVar2 = (pPVar12->properties).
                 super__Vector_base<miniply::PLYProperty,_std::allocator<miniply::PLYProperty>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pPVar14 = (pPVar12->properties).
                       super__Vector_base<miniply::PLYProperty,_std::allocator<miniply::PLYProperty>_>
                       ._M_impl.super__Vector_impl_data._M_start; pPVar14 != pPVar2;
            pPVar14 = pPVar14 + 1) {
          if (pPVar14->countType != None) {
            puVar3 = (pPVar14->rowCount).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            puVar4 = (pPVar14->rowCount).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            if (puVar3 != puVar4) {
              bVar7 = false;
              puVar5 = puVar3;
              do {
                puVar13 = puVar5 + 1;
                if (*puVar5 != *puVar3) {
                  bVar7 = true;
                  break;
                }
                puVar5 = puVar13;
              } while (puVar13 != puVar4);
              if (bVar7) {
                printf("Element \'%s\', list property \'%s\': not all lists have the same size\n",
                       (pPVar12->name)._M_dataplus._M_p,(pPVar14->name)._M_dataplus._M_p);
                goto LAB_0010838b;
              }
            }
            printf("Element \'%s\', list property \'%s\': all lists have size %u\n",
                   (pPVar12->name)._M_dataplus._M_p,(pPVar14->name)._M_dataplus._M_p);
          }
LAB_0010838b:
        }
      }
      miniply::PLYReader::next_element(&local_c0);
    }
  }
  else {
    fprintf(_stderr,"Failed to open %s\n",filename);
  }
  miniply::PLYReader::~PLYReader(&local_c0);
  return bVar6;
}

Assistant:

bool print_ply_header(const char* filename)
{
  miniply::PLYReader reader(filename);
  if (!reader.valid()) {
    fprintf(stderr, "Failed to open %s\n", filename);
    return false;
  }

  printf("ply\n");
  printf("format %s %d.%d\n", kFileTypes[int(reader.file_type())], reader.version_major(), reader.version_minor());
  for (uint32_t i = 0, endI = reader.num_elements(); i < endI; i++) {
    const miniply::PLYElement* elem = reader.get_element(i);
    printf("element %s %u\n", elem->name.c_str(), elem->count);
    for (const miniply::PLYProperty& prop : elem->properties) {
      if (prop.countType != miniply::PLYPropertyType::None) {
        printf("property list %s %s %s\n", kPropertyTypes[uint32_t(prop.countType)], kPropertyTypes[uint32_t(prop.type)], prop.name.c_str());
      }
      else {
        printf("property %s %s\n", kPropertyTypes[uint32_t(prop.type)], prop.name.c_str());
      }
    }
  }
  printf("end_header\n");

  while (reader.has_element()) {
    const miniply::PLYElement* elem = reader.element();
    if (elem->fixedSize || elem->count == 0) {
      reader.next_element();
      continue;
    }

    if (!reader.load_element()) {
      fprintf(stderr, "Element %s failed to load\n", elem->name.c_str());
    }
    for (const miniply::PLYProperty& prop : elem->properties) {
      if (prop.countType == miniply::PLYPropertyType::None) {
        continue;
      }
      bool mixedSize = false;
      const uint32_t firstRowCount = prop.rowCount.front();
      for (const uint32_t rowCount : prop.rowCount) {
        if (rowCount != firstRowCount) {
          mixedSize = true;
          break;
        }
      }
      if (mixedSize) {
        printf("Element '%s', list property '%s': not all lists have the same size\n",
               elem->name.c_str(), prop.name.c_str());
      }
      else {
        printf("Element '%s', list property '%s': all lists have size %u\n",
               elem->name.c_str(), prop.name.c_str(), firstRowCount);
      }
    }
    reader.next_element();
  }

  return true;
}